

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateProto3Field
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  key_type *__k;
  string *element_name;
  char *__rhs;
  CppType CVar1;
  Type TVar2;
  int iVar3;
  iterator iVar4;
  EnumDescriptor *pEVar5;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *this_00;
  long lVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (field[0x42] == (FieldDescriptor)0x1) {
    __k = *(key_type **)(*(long *)(field + 0x50) + 8);
    if ((anonymous_namespace)::AllowedExtendeeInProto3(std::__cxx11::string_const&)::
        allowed_proto3_extendees_abi_cxx11_ == '\0') {
      iVar3 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   AllowedExtendeeInProto3(std::__cxx11::string_const&)::
                                   allowed_proto3_extendees_abi_cxx11_);
      if (iVar3 != 0) {
        this_00 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                   *)operator_new(0x30);
        *(undefined4 *)(this_00 + 8) = 0;
        *(undefined8 *)(this_00 + 0x10) = 0;
        *(_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          **)(this_00 + 0x18) = this_00 + 8;
        *(_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          **)(this_00 + 0x20) = this_00 + 8;
        *(undefined8 *)(this_00 + 0x28) = 0;
        for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 8) {
          std::__cxx11::string::string
                    ((string *)&local_b0,"google.protobuf.",(allocator *)&local_70);
          __rhs = *(char **)((long)&PTR_anon_var_dwarf_609f02_0060df90 + lVar6);
          std::operator+(&local_90,&local_b0,__rhs);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>(this_00,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::string((string *)&local_70,"proto",(allocator *)&local_50);
          std::operator+(&local_b0,&local_70,"2.");
          std::operator+(&local_90,&local_b0,__rhs);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>(this_00,&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_70);
        }
        (anonymous_namespace)::AllowedExtendeeInProto3(std::__cxx11::string_const&)::
        allowed_proto3_extendees_abi_cxx11_ =
             &internal::
              OnShutdownDelete<std::set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                        ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)this_00)->_M_t;
        __cxa_guard_release(&(anonymous_namespace)::
                             AllowedExtendeeInProto3(std::__cxx11::string_const&)::
                             allowed_proto3_extendees_abi_cxx11_);
      }
    }
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((anonymous_namespace)::AllowedExtendeeInProto3(std::__cxx11::string_const&)::
                   allowed_proto3_extendees_abi_cxx11_,__k);
    if ((_Rb_tree_header *)iVar4._M_node ==
        &((anonymous_namespace)::AllowedExtendeeInProto3(std::__cxx11::string_const&)::
          allowed_proto3_extendees_abi_cxx11_->_M_impl).super__Rb_tree_header) {
      AddError(this,*(string **)(field + 8),&proto->super_Message,EXTENDEE,
               "Extensions in proto3 are only allowed for defining options.");
    }
  }
  if (*(int *)(field + 0x3c) == 2) {
    AddError(this,*(string **)(field + 8),&proto->super_Message,TYPE,
             "Required fields are not allowed in proto3.");
  }
  if (field[0x40] == (FieldDescriptor)0x1) {
    AddError(this,*(string **)(field + 8),&proto->super_Message,DEFAULT_VALUE,
             "Explicit default values are not allowed in proto3.");
  }
  CVar1 = FieldDescriptor::cpp_type(field);
  if (CVar1 == CPPTYPE_ENUM) {
    pEVar5 = FieldDescriptor::enum_type(field);
    if (pEVar5 != (EnumDescriptor *)0x0) {
      pEVar5 = FieldDescriptor::enum_type(field);
      if (*(int *)(*(long *)(pEVar5 + 0x10) + 0x3c) != 3) {
        element_name = *(string **)(field + 8);
        pEVar5 = FieldDescriptor::enum_type(field);
        std::operator+(&local_50,"Enum type \"",
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (pEVar5 + 8));
        std::operator+(&local_70,&local_50,"\" is not a proto3 enum, but is used in \"");
        std::operator+(&local_b0,&local_70,
                       *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                        (*(long *)(field + 0x50) + 8));
        std::operator+(&local_90,&local_b0,"\" which is a proto3 message type.");
        AddError(this,element_name,&proto->super_Message,TYPE,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
  }
  TVar2 = FieldDescriptor::type(field);
  if (TVar2 == TYPE_GROUP) {
    AddError(this,*(string **)(field + 8),&proto->super_Message,TYPE,
             "Groups are not supported in proto3 syntax.");
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateProto3Field(FieldDescriptor* field,
                                            const FieldDescriptorProto& proto) {
  if (field->is_extension() &&
      !AllowedExtendeeInProto3(field->containing_type()->full_name())) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::EXTENDEE,
             "Extensions in proto3 are only allowed for defining options.");
  }
  if (field->is_required()) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Required fields are not allowed in proto3.");
  }
  if (field->has_default_value()) {
    AddError(field->full_name(), proto,
             DescriptorPool::ErrorCollector::DEFAULT_VALUE,
             "Explicit default values are not allowed in proto3.");
  }
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM &&
      field->enum_type() &&
      field->enum_type()->file()->syntax() != FileDescriptor::SYNTAX_PROTO3) {
    // Proto3 messages can only use Proto3 enum types; otherwise we can't
    // guarantee that the default value is zero.
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Enum type \"" + field->enum_type()->full_name() +
                 "\" is not a proto3 enum, but is used in \"" +
                 field->containing_type()->full_name() +
                 "\" which is a proto3 message type.");
  }
  if (field->type() == FieldDescriptor::TYPE_GROUP) {
    AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
             "Groups are not supported in proto3 syntax.");
  }
}